

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O3

void check_function<arg_res_tuple<long_double,3ul>,long_double>
               (arg_res_tuple<long_double,_3UL> *x_yref,longdouble y)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  AssertionHandler catchAssertionHandler;
  tuple<long_double,_long_double> y_min_max;
  ScopedMessage scopedMessage0;
  stringstream stream;
  StringRef local_2c8;
  char local_2b8 [16];
  MessageBuilder local_2a8;
  SourceLineInfo local_248;
  tuple<long_double,_long_double> local_238;
  StringRef local_210;
  SourceLineInfo local_200;
  ScopedMessage local_1f0;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  bounds<long_double>(&local_238,x_yref->y);
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x13;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"args: ",6);
  pbVar1 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)&local_190,&x_yref->x);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar1,"lower bound: ",0xd);
  poVar2 = std::ostream::_M_insert<long_double>
                     (local_238.super__Tuple_impl<0UL,_long_double,_long_double>.
                      super__Head_base<0UL,_long_double,_false>._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"upper bound: ",0xd);
  poVar2 = std::ostream::_M_insert<long_double>
                     (local_238.super__Tuple_impl<0UL,_long_double,_long_double>.
                      super__Tuple_impl<1UL,_long_double>.super__Head_base<1UL,_long_double,_false>.
                      _M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"actual     : ",0xd);
  std::ostream::_M_insert<long_double>(y);
  local_248.file = "INFO";
  local_248.line = 4;
  local_200.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_200.line = 0x79;
  Catch::MessageBuilder::MessageBuilder(&local_2a8,(StringRef *)&local_248,&local_200,Info);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (local_2a8.super_MessageStream.m_stream.m_oss,local_2c8.m_start,local_2c8.m_size);
  Catch::ScopedMessage::ScopedMessage(&local_1f0,&local_2a8);
  if (local_2c8.m_start != local_2b8) {
    operator_delete(local_2c8.m_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_info.message._M_dataplus._M_p != &local_2a8.m_info.message.field_2) {
    operator_delete(local_2a8.m_info.message._M_dataplus._M_p);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_2a8);
  local_2c8.m_start = "REQUIRE";
  local_2c8.m_size = 7;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_248.line = 0x7a;
  Catch::StringRef::StringRef(&local_210,"(y_min <= y and y <= y_max)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_2a8,&local_2c8,&local_248,local_210,Normal);
  local_2c8.m_start =
       (char *)CONCAT71(local_2c8.m_start._1_7_,
                        y <= local_238.super__Tuple_impl<0UL,_long_double,_long_double>.
                             super__Tuple_impl<1UL,_long_double>.
                             super__Head_base<1UL,_long_double,_false>._M_head_impl &&
                        local_238.super__Tuple_impl<0UL,_long_double,_long_double>.
                        super__Head_base<0UL,_long_double,_false>._M_head_impl <= y);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_2a8,(ExprLhs<bool> *)&local_2c8);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_2a8);
  if (local_2a8.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_2a8.m_info.message.field_2._8_8_ + 0x70))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}